

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enteringInitializingMode(Federate *this,IterationResult iterating)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  char in_SIL;
  long *in_RDI;
  undefined1 __args;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  undefined8 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  updateFederateMode((Federate *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
                     (Modes)((ulong)in_stack_ffffffffffffffe8 >> 0x38));
  peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x21cb00);
  uVar4 = *(uint *)(in_RDI + 2);
  iVar2 = (*peVar3->_vptr_Core[0x21])(peVar3,(ulong)uVar4);
  in_RDI[5] = CONCAT44(extraout_var,iVar2);
  if (in_SIL == '\0') {
    (**(code **)(*in_RDI + 0x58))();
  }
  __args = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = std::function::operator_cast_to_bool((function<void_(bool)> *)0x21cb51);
  if (bVar1) {
    std::function<void_(bool)>::operator()
              ((function<void_(bool)> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),(bool)__args);
  }
  return;
}

Assistant:

void Federate::enteringInitializingMode(IterationResult iterating)
{
    updateFederateMode(Modes::INITIALIZING);
    mCurrentTime = coreObject->getCurrentTime(fedID);
    if (iterating == IterationResult::NEXT_STEP) {
        startupToInitializeStateTransition();
    }
    if (initializingEntryCallback) {
        initializingEntryCallback(iterating != IterationResult::NEXT_STEP);
    }
}